

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

uint Json::utf8ToCodepoint(char **s,char *e)

{
  uint local_40;
  uint local_3c;
  uint local_38;
  uint calculated_2;
  uint calculated_1;
  uint calculated;
  uint firstByte;
  uint REPLACEMENT_CHARACTER;
  char *e_local;
  char **s_local;
  
  s_local._4_4_ = (uint)(byte)**s;
  if (0x7f < s_local._4_4_) {
    if (s_local._4_4_ < 0xe0) {
      if ((long)e - (long)*s < 2) {
        s_local._4_4_ = 0xfffd;
      }
      else {
        local_38 = (s_local._4_4_ & 0x1f) << 6 | (int)(*s)[1] & 0x3fU;
        *s = *s + 1;
        if (local_38 < 0x80) {
          local_38 = 0xfffd;
        }
        s_local._4_4_ = local_38;
      }
    }
    else if (s_local._4_4_ < 0xf0) {
      if ((long)e - (long)*s < 3) {
        s_local._4_4_ = 0xfffd;
      }
      else {
        local_3c = (s_local._4_4_ & 0xf) << 0xc | ((int)(*s)[1] & 0x3fU) << 6 | (int)(*s)[2] & 0x3fU
        ;
        *s = *s + 2;
        if ((local_3c < 0xd800) || (0xdfff < local_3c)) {
          if (local_3c < 0x800) {
            local_3c = 0xfffd;
          }
          s_local._4_4_ = local_3c;
        }
        else {
          s_local._4_4_ = 0xfffd;
        }
      }
    }
    else if (s_local._4_4_ < 0xf8) {
      if ((long)e - (long)*s < 4) {
        s_local._4_4_ = 0xfffd;
      }
      else {
        local_40 = (s_local._4_4_ & 7) << 0x12 | ((int)(*s)[1] & 0x3fU) << 0xc |
                   ((int)(*s)[2] & 0x3fU) << 6 | (int)(*s)[3] & 0x3fU;
        *s = *s + 3;
        if (local_40 < 0x10000) {
          local_40 = 0xfffd;
        }
        s_local._4_4_ = local_40;
      }
    }
    else {
      s_local._4_4_ = 0xfffd;
    }
  }
  return s_local._4_4_;
}

Assistant:

static unsigned int utf8ToCodepoint(const char*& s, const char* e) {
  const unsigned int REPLACEMENT_CHARACTER = 0xFFFD;

  unsigned int firstByte = static_cast<unsigned char>(*s);

  if (firstByte < 0x80)
    return firstByte;

  if (firstByte < 0xE0) {
    if (e - s < 2)
      return REPLACEMENT_CHARACTER;

    unsigned int calculated =
        ((firstByte & 0x1F) << 6) | (static_cast<unsigned int>(s[1]) & 0x3F);
    s += 1;
    // oversized encoded characters are invalid
    return calculated < 0x80 ? REPLACEMENT_CHARACTER : calculated;
  }

  if (firstByte < 0xF0) {
    if (e - s < 3)
      return REPLACEMENT_CHARACTER;

    unsigned int calculated = ((firstByte & 0x0F) << 12) |
                              ((static_cast<unsigned int>(s[1]) & 0x3F) << 6) |
                              (static_cast<unsigned int>(s[2]) & 0x3F);
    s += 2;
    // surrogates aren't valid codepoints itself
    // shouldn't be UTF-8 encoded
    if (calculated >= 0xD800 && calculated <= 0xDFFF)
      return REPLACEMENT_CHARACTER;
    // oversized encoded characters are invalid
    return calculated < 0x800 ? REPLACEMENT_CHARACTER : calculated;
  }

  if (firstByte < 0xF8) {
    if (e - s < 4)
      return REPLACEMENT_CHARACTER;

    unsigned int calculated = ((firstByte & 0x07) << 18) |
                              ((static_cast<unsigned int>(s[1]) & 0x3F) << 12) |
                              ((static_cast<unsigned int>(s[2]) & 0x3F) << 6) |
                              (static_cast<unsigned int>(s[3]) & 0x3F);
    s += 3;
    // oversized encoded characters are invalid
    return calculated < 0x10000 ? REPLACEMENT_CHARACTER : calculated;
  }

  return REPLACEMENT_CHARACTER;
}